

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_string.h
# Opt level: O2

const_iterator * __thiscall
agge::annotated_string<char,_agge::style_modifier>::ranges_end
          (const_iterator *__return_storage_ptr__,annotated_string<char,_agge::style_modifier> *this
          )

{
  const_iterator next_annotation;
  range local_28;
  
  local_28.
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .begin_index = (this->_underlying)._M_string_length;
  next_annotation._M_current =
       (this->_annotations).
       super__Vector_base<std::pair<agge::style_modifier,_unsigned_long>,_std::allocator<std::pair<agge::style_modifier,_unsigned_long>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .end_index = local_28.
               super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .begin_index;
  local_28.
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._container = &this->_underlying;
  const_iterator::const_iterator(__return_storage_ptr__,&local_28,next_annotation,next_annotation);
  return __return_storage_ptr__;
}

Assistant:

inline typename annotated_string<CharT, AnnotationT>::const_iterator
		annotated_string<CharT, AnnotationT>::ranges_end() const
	{
		range r(_underlying);

		return r.set_end(), const_iterator(r, _annotations.end(), _annotations.end());
	}